

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_info.cc
# Opt level: O1

void * v2i_AUTHORITY_INFO_ACCESS
                 (X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  void *pvVar2;
  ASN1_VALUE *val;
  char *pcVar3;
  GENERAL_NAME *pGVar4;
  ASN1_OBJECT *pAVar5;
  size_t sVar6;
  OPENSSL_STACK *pOVar7;
  CONF_VALUE ctmp;
  CONF_VALUE local_48;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_0022929a:
    pOVar7 = (OPENSSL_STACK *)0x0;
  }
  else {
    sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar1 != 0) {
      sVar1 = 0;
      do {
        pvVar2 = OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar1);
        val = ASN1_item_new((ASN1_ITEM *)&ACCESS_DESCRIPTION_it);
        if (val == (ASN1_VALUE *)0x0) goto LAB_0022929a;
        pcVar3 = strchr(*(char **)((long)pvVar2 + 8),0x3b);
        if (pcVar3 == (char *)0x0) {
          ERR_put_error(0x14,0,0x87,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_info.cc"
                        ,0x89);
          if (val != (ASN1_VALUE *)0x0) {
LAB_00229272:
            ASN1_item_free(val,(ASN1_ITEM *)&ACCESS_DESCRIPTION_it);
          }
          goto LAB_0022929a;
        }
        local_48.name = pcVar3 + 1;
        local_48.value = *(char **)((long)pvVar2 + 0x10);
        pGVar4 = v2i_GENERAL_NAME_ex(*(GENERAL_NAME **)(val + 8),(X509V3_EXT_METHOD *)method,
                                     (X509V3_CTX *)ctx,&local_48,0);
        if ((pGVar4 == (GENERAL_NAME *)0x0) ||
           (pcVar3 = OPENSSL_strndup(*(char **)((long)pvVar2 + 8),
                                     (long)pcVar3 - (long)*(char **)((long)pvVar2 + 8)),
           pcVar3 == (char *)0x0)) goto LAB_00229272;
        pAVar5 = OBJ_txt2obj(pcVar3,0);
        *(ASN1_OBJECT **)val = pAVar5;
        if (pAVar5 == (ASN1_OBJECT *)0x0) {
          ERR_put_error(0x14,0,0x65,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_info.cc"
                        ,0x98);
          ERR_add_error_data(2,"value=",pcVar3);
          if (pcVar3 != (char *)0x0) {
            OPENSSL_free(pcVar3);
          }
          goto LAB_00229272;
        }
        sVar6 = OPENSSL_sk_push(sk,val);
        if (sVar6 == 0) {
          ASN1_item_free(val,(ASN1_ITEM *)&ACCESS_DESCRIPTION_it);
          OPENSSL_free(pcVar3);
          goto LAB_0022929a;
        }
        OPENSSL_free(pcVar3);
        sVar1 = sVar1 + 1;
        sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar1 < sVar6);
    }
    pOVar7 = sk;
    sk = (OPENSSL_STACK *)0x0;
  }
  if (sk != (OPENSSL_STACK *)0x0) {
    OPENSSL_sk_pop_free_ex
              (sk,bssl::internal::DeleterImpl<stack_st_ACCESS_DESCRIPTION,_void>::Free::
                  anon_class_1_0_00000001::__invoke,(OPENSSL_sk_free_func)0x0);
  }
  return pOVar7;
}

Assistant:

static void *v2i_AUTHORITY_INFO_ACCESS(const X509V3_EXT_METHOD *method,
                                       const X509V3_CTX *ctx,
                                       const STACK_OF(CONF_VALUE) *nval) {
  bssl::UniquePtr<AUTHORITY_INFO_ACCESS> ainfo(sk_ACCESS_DESCRIPTION_new_null());
  if (ainfo == nullptr) {
    return nullptr;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    bssl::UniquePtr<ACCESS_DESCRIPTION> acc(ACCESS_DESCRIPTION_new());
    if (acc == nullptr) {
      return nullptr;
    }
    char *ptmp = strchr(cnf->name, ';');
    if (!ptmp) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SYNTAX);
      return nullptr;
    }
    CONF_VALUE ctmp;
    ctmp.name = ptmp + 1;
    ctmp.value = cnf->value;
    if (!v2i_GENERAL_NAME_ex(acc->location, method, ctx, &ctmp, 0)) {
      return nullptr;
    }
    bssl::UniquePtr<char> objtmp(OPENSSL_strndup(cnf->name, ptmp - cnf->name));
    if (objtmp == nullptr) {
      return nullptr;
    }
    acc->method = OBJ_txt2obj(objtmp.get(), 0);
    if (!acc->method) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_BAD_OBJECT);
      ERR_add_error_data(2, "value=", objtmp.get());
      return nullptr;
    }
    if (!bssl::PushToStack(ainfo.get(), std::move(acc))) {
      return nullptr;
    }
  }
  return ainfo.release();
}